

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.h
# Opt level: O0

bitmask<slang::ast::VariableFlags> slang::ast::operator|(VariableFlags l,VariableFlags r)

{
  bitmask<slang::ast::VariableFlags> bVar1;
  bitmask<slang::ast::VariableFlags> local_12;
  bitmask<slang::ast::VariableFlags> local_10;
  VariableFlags local_e;
  VariableFlags local_c;
  VariableFlags r_local;
  VariableFlags l_local;
  
  local_e = r;
  local_c = l;
  bitmask<slang::ast::VariableFlags>::bitmask(&local_10,l);
  bitmask<slang::ast::VariableFlags>::bitmask(&local_12,local_e);
  bVar1 = bitmask<slang::ast::VariableFlags>::operator|(&local_10,&local_12);
  return (bitmask<slang::ast::VariableFlags>)bVar1.m_bits;
}

Assistant:

class SLANG_EXPORT VariableSymbol : public ValueSymbol {
public:
    VariableLifetime lifetime;
    bitmask<VariableFlags> flags;

    VariableSymbol(string_view name, SourceLocation loc, VariableLifetime lifetime);

    void serializeTo(ASTSerializer& serializer) const;

    /// Constructs all variable symbols specified by the given syntax node. Note that
    /// this might actually construct net symbols if the data type syntax refers to
    /// a user defined net type or alias.
    static void fromSyntax(Compilation& compilation, const syntax::DataDeclarationSyntax& syntax,
                           const Scope& scope, SmallVectorBase<const ValueSymbol*>& results);

    static VariableSymbol& fromSyntax(Compilation& compilation,
                                      const syntax::ForVariableDeclarationSyntax& syntax,
                                      const VariableSymbol* lastVar);

    static bool isKind(SymbolKind kind) {
        switch (kind) {
            case SymbolKind::Variable:
            case SymbolKind::FormalArgument:
            case SymbolKind::Field:
            case SymbolKind::ClassProperty:
            case SymbolKind::Iterator:
            case SymbolKind::PatternVar:
            case SymbolKind::ClockVar:
            case SymbolKind::LocalAssertionVar:
                return true;
            default:
                return false;
        }
    }

protected:
    VariableSymbol(SymbolKind childKind, string_view name, SourceLocation loc,
                   VariableLifetime lifetime);
}